

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ootake_PSG.c
# Opt level: O1

UINT8 device_start_c6280_ootake(DEV_GEN_CFG *cfg,DEV_INFO *retDevInf)

{
  double dVar1;
  UINT8 UVar2;
  uint uVar3;
  uint uVar4;
  DEV_DATA DVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  huc6280_state *info;
  long lVar9;
  
  uVar4 = cfg->clock;
  if ((cfg->srMode == '\x01') ||
     ((uVar6 = uVar4 >> 4, cfg->srMode == '\x02' && (uVar6 < cfg->smplRate)))) {
    uVar6 = cfg->smplRate;
  }
  if (_bTblInit == '\0') {
    _VolumeTable[0] = 0;
    lVar9 = 1;
    iVar8 = 0x5a;
    do {
      dVar1 = pow(10.0,((double)iVar8 * -1.08689999991) / 20.0);
      _VolumeTable[lVar9] = (int)(dVar1 * 32768.0);
      lVar9 = lVar9 + 1;
      iVar8 = iVar8 + -1;
    } while (lVar9 != 0x5c);
    uVar3 = 0x100;
    lVar9 = 0;
    do {
      uVar7 = uVar3 & 1;
      uVar3 = ((uVar3 ^ uVar3 >> 1) & 1) << 0xe | uVar3 >> 1;
      *(uint *)((long)_NoiseTable + lVar9) = -(uint)(uVar7 == 0) | 0xffffffee;
      lVar9 = lVar9 + 4;
    } while (lVar9 != 0x20000);
    _bTblInit = '\x01';
  }
  DVar5.chipInf = calloc(1,0x678);
  lVar9 = 0;
  if (DVar5.chipInf == (void *)0x0) {
    DVar5.chipInf = (void *)0x0;
  }
  else {
    *(double *)((long)DVar5.chipInf + 0x10) = (double)uVar4;
    *(undefined8 *)((long)DVar5.chipInf + 0x63c) = 0;
    *(undefined8 *)((long)DVar5.chipInf + 0x644) = 0;
    *(undefined4 *)((long)DVar5.chipInf + 0x64c) = 0;
    *(undefined8 *)((long)DVar5.chipInf + 0x640) = 0x3f80cd578fb0f835;
    *(undefined8 *)((long)DVar5.chipInf + 0x648) = 0x3f80000000000000;
    *(undefined4 *)((long)DVar5.chipInf + 0x634) = 0;
    *(undefined8 *)((long)DVar5.chipInf + 0x658) = 0;
    memset(DVar5.chipInf + 0x20,0,0x610);
    do {
      do {
        *(undefined4 *)
         ((long)(DVar5.chipInf + 0x20) +
         lVar9 * 4 + (ulong)*(uint *)((long)DVar5.chipInf + 0x620) * 0xb8 + 0x1c) = 0x11;
        lVar9 = lVar9 + 1;
      } while (lVar9 != 0x20);
      uVar4 = *(int *)((long)DVar5.chipInf + 0x620) + 1;
      *(uint *)((long)DVar5.chipInf + 0x620) = uVar4;
      lVar9 = 0;
    } while (uVar4 < 6);
    *(undefined4 *)((long)DVar5.chipInf + 0x620) = 0;
    *(undefined4 *)((long)DVar5.chipInf + 0x650) = 0;
    *(undefined2 *)((long)DVar5.chipInf + 0x654) = 0;
    *(double *)((long)DVar5.chipInf + 8) = (double)uVar6;
    *(double *)((long)DVar5.chipInf + 0x18) =
         *(double *)((long)DVar5.chipInf + 0x10) / (double)uVar6;
  }
  if (DVar5.chipInf == (void *)0x0) {
    UVar2 = 0xff;
  }
  else {
    *(UINT8 *)&((DEV_DATA *)((long)DVar5.chipInf + 0x670))->chipInf = cfg->flags;
    *(void **)DVar5.chipInf = DVar5.chipInf;
    retDevInf->dataPtr = (DEV_DATA *)DVar5.chipInf;
    retDevInf->sampleRate = uVar6;
    retDevInf->devDef = &devDef_C6280_Ootake;
    retDevInf->linkDevCount = 0;
    retDevInf->linkDevs = (DEVLINK_INFO *)0x0;
    UVar2 = '\0';
  }
  return UVar2;
}

Assistant:

static UINT8 device_start_c6280_ootake(const DEV_GEN_CFG* cfg, DEV_INFO* retDevInf)
{
	void* chip;
	DEV_DATA* devData;
	UINT32 rate;
	
	rate = cfg->clock / 16;
	SRATE_CUSTOM_HIGHEST(cfg->srMode, rate, cfg->smplRate);
	
	chip = OPSG_Init(cfg->clock, rate);
	if (chip == NULL)
		return 0xFF;
	
	OPSG_SetHoneyInTheSky(chip, cfg->flags);
	
	devData = (DEV_DATA*)chip;
	devData->chipInf = chip;
	INIT_DEVINF(retDevInf, devData, rate, &devDef_C6280_Ootake);
	return 0x00;
}